

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O2

void __thiscall
libtorrent::dht::dht_tracker::put_item
          (dht_tracker *this,public_key *key,function<void_(const_libtorrent::dht::item_&,_int)> *cb
          ,function<void_(libtorrent::dht::item_&)> *data_cb,string *salt)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Rb_tree_node_base *p_Var3;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  string *local_a8;
  function<void_(libtorrent::dht::item_&)> *local_a0;
  _Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>))(const_libtorrent::dht::item_&,_int,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>)>
  local_98;
  shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx> ctx;
  function<void_(libtorrent::dht::item_&)> local_50;
  
  local_98._M_f =
       (_func_void_item_ptr_int_shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>_function<void_(const_libtorrent::dht::item_&,_int)>
        *)CONCAT44(local_98._M_f._4_4_,
                   (int)(this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_a8 = salt;
  local_a0 = data_cb;
  ::std::make_shared<libtorrent::dht::(anonymous_namespace)::put_item_ctx,int>((int *)&ctx);
  for (p_Var3 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var3)) {
    local_98._M_f = anon_unknown_20::put_mutable_item_callback;
    ::std::function<void_(const_libtorrent::dht::item_&,_int)>::function
              ((function<void_(const_libtorrent::dht::item_&,_int)> *)&local_98._M_bound_args,cb);
    ::std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>::shared_ptr
              (&local_98._M_bound_args.
                super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
                .
                super__Tuple_impl<1UL,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
                .
                super__Tuple_impl<2UL,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
                .
                super__Head_base<2UL,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_false>
                ._M_head_impl,&ctx);
    local_b8 = (code *)0x0;
    pcStack_b0 = (code *)0x0;
    local_c8._M_unused._M_object = (void *)0x0;
    local_c8._8_8_ = 0;
    local_c8._M_unused._M_object = operator_new(0x38);
    _Var2._M_pi = local_98._M_bound_args.
                  super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
                  .
                  super__Tuple_impl<1UL,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
                  .
                  super__Tuple_impl<2UL,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
                  .
                  super__Head_base<2UL,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_false>
                  ._M_head_impl.
                  super___shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    peVar1 = local_98._M_bound_args.
             super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
             .
             super__Tuple_impl<1UL,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
             .
             super__Tuple_impl<2UL,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
             .
             super__Head_base<2UL,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_false>
             ._M_head_impl.
             super___shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    *(_func_void_item_ptr_int_shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>_function<void_(const_libtorrent::dht::item_&,_int)>
      **)local_c8._M_unused._0_8_ = local_98._M_f;
    *(undefined8 *)((long)local_c8._M_unused._0_8_ + 8) = 0;
    *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x10) = 0;
    *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x18) = 0;
    *(_Invoker_type *)((long)local_c8._M_unused._0_8_ + 0x20) =
         local_98._M_bound_args.
         super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
         .
         super__Tuple_impl<1UL,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
         .
         super__Tuple_impl<2UL,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
         .super__Tuple_impl<3UL,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>.
         super__Head_base<3UL,_std::function<void_(const_libtorrent::dht::item_&,_int)>,_false>.
         _M_head_impl._M_invoker;
    if (local_98._M_bound_args.
        super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
        .
        super__Tuple_impl<1UL,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
        .
        super__Tuple_impl<2UL,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
        .super__Tuple_impl<3UL,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>.
        super__Head_base<3UL,_std::function<void_(const_libtorrent::dht::item_&,_int)>,_false>.
        _M_head_impl.super__Function_base._M_manager != (_Manager_type)0x0) {
      *(void **)((long)local_c8._M_unused._0_8_ + 8) =
           local_98._M_bound_args.
           super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
           .
           super__Tuple_impl<1UL,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
           .
           super__Tuple_impl<2UL,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
           .super__Tuple_impl<3UL,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>.
           super__Head_base<3UL,_std::function<void_(const_libtorrent::dht::item_&,_int)>,_false>.
           _M_head_impl.super__Function_base._M_functor._M_unused._M_object;
      *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x10) =
           local_98._M_bound_args.
           super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
           .
           super__Tuple_impl<1UL,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
           .
           super__Tuple_impl<2UL,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
           .super__Tuple_impl<3UL,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>.
           super__Head_base<3UL,_std::function<void_(const_libtorrent::dht::item_&,_int)>,_false>.
           _M_head_impl.super__Function_base._M_functor._8_8_;
      *(_Manager_type *)((long)local_c8._M_unused._0_8_ + 0x18) =
           local_98._M_bound_args.
           super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
           .
           super__Tuple_impl<1UL,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
           .
           super__Tuple_impl<2UL,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
           .super__Tuple_impl<3UL,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>.
           super__Head_base<3UL,_std::function<void_(const_libtorrent::dht::item_&,_int)>,_false>.
           _M_head_impl.super__Function_base._M_manager;
      local_98._M_bound_args.
      super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
      .
      super__Tuple_impl<2UL,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
      .super__Tuple_impl<3UL,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>.
      super__Head_base<3UL,_std::function<void_(const_libtorrent::dht::item_&,_int)>,_false>.
      _M_head_impl.super__Function_base._M_manager = (_Manager_type)0x0;
      local_98._M_bound_args.
      super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
      .
      super__Tuple_impl<2UL,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
      .super__Tuple_impl<3UL,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>.
      super__Head_base<3UL,_std::function<void_(const_libtorrent::dht::item_&,_int)>,_false>.
      _M_head_impl._M_invoker = (_Invoker_type)0x0;
    }
    local_98._M_bound_args.
    super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
    .
    super__Tuple_impl<2UL,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
    .
    super__Head_base<2UL,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_false>
    ._M_head_impl.
    super___shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98._M_bound_args.
    super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
    .
    super__Tuple_impl<2UL,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>_>
    .
    super__Head_base<2UL,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_false>
    ._M_head_impl.
    super___shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    *(element_type **)((long)local_c8._M_unused._0_8_ + 0x28) = peVar1;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_c8._M_unused._0_8_ + 0x30) =
         _Var2._M_pi;
    pcStack_b0 = ::std::
                 _Function_handler<void_(const_libtorrent::dht::item_&,_int),_std::_Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>))(const_libtorrent::dht::item_&,_int,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>)>_>
                 ::_M_invoke;
    local_b8 = ::std::
               _Function_handler<void_(const_libtorrent::dht::item_&,_int),_std::_Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>))(const_libtorrent::dht::item_&,_int,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>)>_>
               ::_M_manager;
    ::std::function<void_(libtorrent::dht::item_&)>::function(&local_50,local_a0);
    dht::node::put_item((node *)&p_Var3[1]._M_left,key,local_a8,
                        (function<void_(const_libtorrent::dht::item_&,_int)> *)&local_c8,&local_50);
    ::std::_Function_base::~_Function_base(&local_50.super__Function_base);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_c8);
    ::std::
    _Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>))(const_libtorrent::dht::item_&,_int,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>)>
    ::~_Bind(&local_98);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ctx.
              super___shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void dht_tracker::put_item(public_key const& key
		, std::function<void(item const&, int)> cb
		, std::function<void(item&)> data_cb, std::string salt)
	{
		auto ctx = std::make_shared<put_item_ctx>(int(m_nodes.size()));
		for (auto& n : m_nodes)
			n.second.dht.put_item(key, salt, std::bind(&put_mutable_item_callback
				, _1, _2, ctx, cb), data_cb);
	}